

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_intlog.cpp
# Opt level: O3

void __thiscall
bitmanip::anon_unknown_0::Test_intlog_log2floor_manual_::run(Test_intlog_log2floor_manual_ *this)

{
  return;
}

Assistant:

BITMANIP_TEST(intlog, log2floor_manual)
{
    BITMANIP_STATIC_ASSERT_EQ(log2floor(0u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log2floor_debruijn(0u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log2floor_fast(0u), 0u);
    BITMANIP_STATIC_ASSERT_EQ(log2floor_naive(0u), 0u);
}